

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O3

uint32_t lzma_mf_hc4_find(lzma_mf *mf,lzma_match *matches)

{
  uint8_t *cur;
  uint32_t uVar1;
  uint32_t cur_match;
  uint8_t *puVar2;
  uint32_t *puVar3;
  bool bVar4;
  uint uVar5;
  lzma_match *plVar6;
  uint uVar7;
  uint32_t pos;
  uint len_limit;
  uint uVar8;
  uint uVar9;
  uint32_t uVar10;
  long lVar11;
  ulong uVar12;
  
  uVar5 = mf->read_pos;
  uVar7 = mf->write_pos - uVar5;
  len_limit = mf->nice_len;
  if ((uVar7 < mf->nice_len) && (len_limit = uVar7, uVar7 < 4)) {
    if (mf->action != LZMA_RUN) {
      move_pending(mf);
      return 0;
    }
    __assert_fail("mf->action != LZMA_RUN",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                  ,0x18a,"uint32_t lzma_mf_hc4_find(lzma_mf *, lzma_match *)");
  }
  puVar2 = mf->buffer;
  puVar3 = mf->hash;
  cur = puVar2 + uVar5;
  pos = mf->offset + uVar5;
  uVar9 = (uint)puVar2[(ulong)uVar5 + 1] ^ lzma_crc32_table[0][puVar2[uVar5]];
  uVar8 = (uint)puVar2[(ulong)uVar5 + 2] << 8 ^ uVar9;
  uVar9 = uVar9 & 0x3ff;
  uVar12 = (ulong)(uVar8 & 0xffff);
  uVar10 = puVar3[uVar9];
  uVar7 = pos - uVar10;
  uVar1 = puVar3[uVar12 + 0x400];
  uVar5 = ((lzma_crc32_table[0][puVar2[(ulong)uVar5 + 3]] << 5 ^ uVar8) & mf->hash_mask) + 0x10400;
  cur_match = puVar3[uVar5];
  puVar3[uVar9] = pos;
  puVar3[uVar12 + 0x400] = pos;
  puVar3[uVar5] = pos;
  uVar5 = mf->cyclic_size;
  lVar11 = 0;
  bVar4 = true;
  uVar8 = 1;
  if ((uVar7 < uVar5) && (cur[-(ulong)uVar7] == *cur)) {
    matches->len = 2;
    matches->dist = uVar7 - 1;
    lVar11 = 1;
    uVar8 = 2;
    bVar4 = false;
  }
  if (((uVar1 == uVar10) || (uVar9 = pos - uVar1, uVar5 <= uVar9)) || (cur[-(ulong)uVar9] != *cur))
  {
    uVar12 = 1;
    if (bVar4) {
      uVar12 = 0;
LAB_004f40cb:
      uVar10 = 3;
      if (3 < uVar8) {
        uVar10 = uVar8;
      }
      plVar6 = hc_find_func(len_limit,pos,cur,cur_match,mf->depth,mf->son,mf->cyclic_pos,uVar5,
                            matches + uVar12,uVar10);
      uVar10 = (uint32_t)((ulong)((long)plVar6 - (long)matches) >> 3);
      goto LAB_004f4103;
    }
  }
  else {
    uVar12 = (ulong)((int)lVar11 + 1);
    matches[lVar11].dist = uVar9 - 1;
    uVar8 = 3;
    uVar7 = uVar9;
  }
  uVar10 = (uint32_t)uVar12;
  if (uVar8 != len_limit) {
    do {
      if (cur[(ulong)uVar8 - (ulong)uVar7] != cur[uVar8]) {
        matches[uVar10 - 1].len = uVar8;
        goto LAB_004f40cb;
      }
      uVar8 = uVar8 + 1;
    } while (len_limit != uVar8);
  }
  matches[uVar10 - 1].len = len_limit;
  mf->son[mf->cyclic_pos] = cur_match;
LAB_004f4103:
  move_pos(mf);
  return uVar10;
}

Assistant:

extern uint32_t
lzma_mf_hc4_find(lzma_mf *mf, lzma_match *matches)
{
	const uint8_t *cur;
	uint32_t pos;
	uint32_t temp, hash_value, hash_2_value, hash_3_value; /* hash_4_calc */
	uint32_t delta2, delta3, cur_match;
	uint32_t len_best = 1;
	uint32_t matches_count = 0;

	header_find(false, 4);

	hash_4_calc();

	delta2 = pos - mf->hash[hash_2_value];
	delta3 = pos - mf->hash[FIX_3_HASH_SIZE + hash_3_value];
	cur_match = mf->hash[FIX_4_HASH_SIZE + hash_value];

	mf->hash[hash_2_value ] = pos;
	mf->hash[FIX_3_HASH_SIZE + hash_3_value] = pos;
	mf->hash[FIX_4_HASH_SIZE + hash_value] = pos;

	if (delta2 < mf->cyclic_size && *(cur - delta2) == *cur) {
		len_best = 2;
		matches[0].len = 2;
		matches[0].dist = delta2 - 1;
		matches_count = 1;
	}

	if (delta2 != delta3 && delta3 < mf->cyclic_size
			&& *(cur - delta3) == *cur) {
		len_best = 3;
		matches[matches_count++].dist = delta3 - 1;
		delta2 = delta3;
	}

	if (matches_count != 0) {
		for ( ; len_best != len_limit; ++len_best)
			if (*(cur + len_best - delta2) != cur[len_best])
				break;

		matches[matches_count - 1].len = len_best;

		if (len_best == len_limit) {
			hc_skip();
			return matches_count;
		}
	}

	if (len_best < 3)
		len_best = 3;

	hc_find(len_best);
}